

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O3

void __thiscall
Js::PolymorphicInlineCache::CopyTo
          (PolymorphicInlineCache *this,PropertyId propertyId,ScriptContext *scriptContext,
          PolymorphicInlineCache *clone)

{
  Type pIVar1;
  Type *pTVar2;
  Type *pTVar3;
  code *pcVar4;
  bool bVar5;
  ushort uVar6;
  undefined4 *puVar7;
  long lVar8;
  ulong uVar9;
  Type *type;
  uint inlineCacheIndex;
  ulong uVar10;
  ulong uVar11;
  
  if (clone == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x36d,"(clone)","clone");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
  clone->cloneForJitTimeUse = this->cloneForJitTimeUse;
  uVar6 = this->size;
  if (uVar6 != 0) {
    lVar8 = 0;
    uVar9 = 0;
    do {
      pIVar1 = this->inlineCaches;
      if ((*(byte *)((long)&pIVar1->u + lVar8 + 0x10) & 1) == 0) {
        if ((*(byte *)((long)&pIVar1->u + lVar8) & 1) == 0) {
          if ((*(byte *)((long)&pIVar1->u + lVar8 + 8) & 1) == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = *(ulong *)((long)&pIVar1->u + lVar8 + 0x10);
          }
        }
        else {
          uVar10 = *(ulong *)((long)&pIVar1->u + lVar8 + 8);
        }
      }
      else {
        uVar10 = *(ulong *)((long)&pIVar1->u + lVar8);
      }
      type = (Type *)(uVar10 & 0xfffffffffffffffb);
      if (type != (Type *)0x0) {
        uVar10 = (ulong)clone->size + 0xffffffff & uVar10 >> 6;
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,CloneCacheInCollisionPhase);
        inlineCacheIndex = (uint)uVar10;
        if (!bVar5) {
          pIVar1 = clone->inlineCaches;
          uVar11 = uVar10 & 0xffffffff;
          pTVar2 = pIVar1[uVar11].u.local.type;
          if (pTVar2 != (Type *)0x0) {
            uVar6 = *(ushort *)((long)&pIVar1[uVar11].u + 0x10);
            pTVar3 = pIVar1[uVar11].u.local.typeWithoutProperty;
            if (((((byte)uVar6 & pTVar3 != (Type *)0x0) == 0) && (((uint)pTVar3 & 0xd) != 0xd)) &&
               (this->size != 1)) {
              if ((uVar6 & 1) == 0) {
                if (((ulong)pTVar2 & 1) == 0) {
                  CloneInlineCacheToEmptySlotInCollision<false,false,true>
                            (clone,type,inlineCacheIndex);
                }
                else {
                  CloneInlineCacheToEmptySlotInCollision<false,true,false>
                            (clone,type,inlineCacheIndex);
                }
              }
              else {
                CloneInlineCacheToEmptySlotInCollision<true,false,false>
                          (clone,type,inlineCacheIndex);
              }
            }
          }
        }
        InlineCache::CopyTo((InlineCache *)((long)&this->inlineCaches->u + lVar8),propertyId,
                            scriptContext,clone->inlineCaches + (uVar10 & 0xffffffff));
        UpdateInlineCachesFillInfo(clone,inlineCacheIndex,true);
        uVar6 = this->size;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar9 < uVar6);
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CopyTo(PropertyId propertyId, ScriptContext* scriptContext, PolymorphicInlineCache *const clone)
    {
        Assert(clone);

        clone->ignoreForEquivalentObjTypeSpec = this->ignoreForEquivalentObjTypeSpec;
        clone->cloneForJitTimeUse = this->cloneForJitTimeUse;

        for (uint i = 0; i < GetSize(); ++i)
        {
            Type * type = inlineCaches[i].GetType();
            if (type)
            {
                uint inlineCacheIndex = clone->GetInlineCacheIndexForType(type);

                // When copying inline caches from one polymorphic cache to another, types are again hashed to get the corresponding indices in the new polymorphic cache.
                // This might lead to collision in the new cache. We need to try to resolve that collision.
                if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
                {
                    if (!clone->inlineCaches[inlineCacheIndex].IsEmpty() && !clone->inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
                    {
                        if (clone->inlineCaches[inlineCacheIndex].IsLocal())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                        }
                        else if (clone->inlineCaches[inlineCacheIndex].IsProto())
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                        }
                        else
                        {
                            clone->CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                        }

                    }
                }
                inlineCaches[i].CopyTo(propertyId, scriptContext, &clone->inlineCaches[inlineCacheIndex]);
                clone->UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);
            }
        }
    }